

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

Maj3_Man_t * Maj3_ManAlloc(int nVars,int nNodes,Vec_Int_t *vLevels)

{
  int iVar1;
  Maj3_Man_t *p_00;
  Vec_Wrd_t *pVVar2;
  bmcg_sat_solver *pbVar3;
  Maj3_Man_t *p;
  Vec_Int_t *vLevels_local;
  int nNodes_local;
  int nVars_local;
  
  p_00 = (Maj3_Man_t *)calloc(1,0x11c0);
  p_00->vLevels = vLevels;
  p_00->nVars = nVars;
  p_00->nNodes = nNodes;
  p_00->nObjs = nVars + nNodes;
  iVar1 = Abc_TtWordNum(nVars);
  p_00->nWords = iVar1;
  iVar1 = Maj3_ManMarkup(p_00);
  p_00->iVar = iVar1;
  pVVar2 = Maj3_ManTruthTables(p_00);
  p_00->vInfo = pVVar2;
  pbVar3 = bmcg_sat_solver_start();
  p_00->pSat = pbVar3;
  bmcg_sat_solver_set_nvars(p_00->pSat,p_00->iVar);
  Maj3_ManAddCnfStart(p_00);
  return p_00;
}

Assistant:

Maj3_Man_t * Maj3_ManAlloc( int nVars, int nNodes, Vec_Int_t * vLevels )
{
    Maj3_Man_t * p = ABC_CALLOC( Maj3_Man_t, 1 );
    p->vLevels    = vLevels;
    p->nVars      = nVars;
    p->nNodes     = nNodes;
    p->nObjs      = nVars + nNodes;
    p->nWords     = Abc_TtWordNum(nVars);
    p->iVar       = Maj3_ManMarkup( p );
    p->vInfo      = Maj3_ManTruthTables( p );
    p->pSat       = bmcg_sat_solver_start();
    bmcg_sat_solver_set_nvars( p->pSat, p->iVar );
    Maj3_ManAddCnfStart( p );
    return p;
}